

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void omega_values(int *n_data,int *n,int *c)

{
  uint uVar1;
  
  uVar1 = *n_data;
  if ((int)uVar1 < 0) {
    *n_data = 0;
    uVar1 = 0;
  }
  else if (0x16 < uVar1) {
    *n_data = 0;
    *n = 0;
    *c = 0;
    return;
  }
  *n = (&DAT_002283f0)[uVar1];
  *c = *(int *)(&DAT_00228390 + (long)*n_data * 4);
  *n_data = *n_data + 1;
  return;
}

Assistant:

void omega_values ( int *n_data, int *n, int *c )

//****************************************************************************80
//
//  Purpose:
//
//    OMEGA_VALUES returns some values of the OMEGA function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the argument of the OMEGA function.
//
//    Output, int *C, the value of the OMEGA function.
//
{
# define N_MAX 23

  int c_vec[N_MAX] = {
      1,   1,   1,   1,   1, 
      2,   1,   1,   1,   2, 
      3,   1,   4,   4,   3, 
      1,   5,   2,   2,   1, 
      6,   7,   8 };
  int n_vec[N_MAX] = {
           1,        2,        3,        4,        5, 
           6,        7,        8,        9,       10, 
          30,      101,      210,     1320,     1764, 
        2003,     2310,     2827,     8717,    12553, 
       30030,   510510,  9699690 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *c = 0;
  }
  else
  {
    *n = n_vec[*n_data];
    *c = c_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}